

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QString_&,_QString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QString_&,_QString_&> *this)

{
  long lVar1;
  long lVar2;
  char16_t *__dest;
  char16_t *pcVar3;
  
  if (((this->a->d).ptr == (char16_t *)0x0) && ((this->b->d).ptr == (char16_t *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = (this->b->d).size;
    lVar2 = (this->a->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + lVar2,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar1 = (this->a->d).size;
    if (lVar1 != 0) {
      pcVar3 = (this->a->d).ptr;
      if (pcVar3 == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest,pcVar3,lVar1 * 2);
    }
    lVar2 = (this->b->d).size;
    if (lVar2 != 0) {
      pcVar3 = (this->b->d).ptr;
      if (pcVar3 == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest + lVar1,pcVar3,lVar2 * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }